

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O0

tm * __thiscall
absl::lts_20240722::ToTM(tm *__return_storage_ptr__,lts_20240722 *this,Time t,TimeZone tz)

{
  Time t_00;
  int iVar1;
  Weekday WVar2;
  year_t yVar3;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar4;
  CivilSecond cs_00;
  CivilSecond cs_01;
  tm *tm;
  CivilSecond *cs;
  undefined1 auStack_60 [8];
  CivilInfo ci;
  TimeZone tz_local;
  Time t_local;
  undefined8 extraout_RDX_02;
  
  ci.zone_abbr = (char *)CONCAT44((int)((ulong)register0x00000008 >> 0x20),t.rep_.rep_lo_);
  memset(__return_storage_ptr__,0,0x38);
  t_00.rep_.rep_lo_ = t.rep_.rep_hi_.lo_;
  t_00.rep_.rep_hi_ = (HiRep)this;
  TimeZone::At((CivilInfo *)auStack_60,(TimeZone *)&ci.zone_abbr,t_00);
  iVar1 = time_internal::cctz::detail::civil_time<absl::lts_20240722::time_internal::second_tag>::
          second((civil_time<absl::lts_20240722::time_internal::second_tag> *)auStack_60);
  __return_storage_ptr__->tm_sec = iVar1;
  iVar1 = time_internal::cctz::detail::civil_time<absl::lts_20240722::time_internal::second_tag>::
          minute((civil_time<absl::lts_20240722::time_internal::second_tag> *)auStack_60);
  __return_storage_ptr__->tm_min = iVar1;
  iVar1 = time_internal::cctz::detail::civil_time<absl::lts_20240722::time_internal::second_tag>::
          hour((civil_time<absl::lts_20240722::time_internal::second_tag> *)auStack_60);
  __return_storage_ptr__->tm_hour = iVar1;
  iVar1 = time_internal::cctz::detail::civil_time<absl::lts_20240722::time_internal::second_tag>::
          day((civil_time<absl::lts_20240722::time_internal::second_tag> *)auStack_60);
  __return_storage_ptr__->tm_mday = iVar1;
  iVar1 = time_internal::cctz::detail::civil_time<absl::lts_20240722::time_internal::second_tag>::
          month((civil_time<absl::lts_20240722::time_internal::second_tag> *)auStack_60);
  __return_storage_ptr__->tm_mon = iVar1 + -1;
  yVar3 = time_internal::cctz::detail::civil_time<absl::lts_20240722::time_internal::second_tag>::
          year((civil_time<absl::lts_20240722::time_internal::second_tag> *)auStack_60);
  iVar1 = std::numeric_limits<int>::min();
  if (yVar3 < iVar1 + 0x76c) {
    iVar1 = std::numeric_limits<int>::min();
    __return_storage_ptr__->tm_year = iVar1;
    uVar4 = extraout_RDX;
  }
  else {
    yVar3 = time_internal::cctz::detail::civil_time<absl::lts_20240722::time_internal::second_tag>::
            year((civil_time<absl::lts_20240722::time_internal::second_tag> *)auStack_60);
    iVar1 = std::numeric_limits<int>::max();
    if (iVar1 < yVar3) {
      iVar1 = std::numeric_limits<int>::max();
      __return_storage_ptr__->tm_year = iVar1 + -0x76c;
      uVar4 = extraout_RDX_00;
    }
    else {
      yVar3 = time_internal::cctz::detail::civil_time<absl::lts_20240722::time_internal::second_tag>
              ::year((civil_time<absl::lts_20240722::time_internal::second_tag> *)auStack_60);
      __return_storage_ptr__->tm_year = (int)yVar3 + -0x76c;
      uVar4 = extraout_RDX_01;
    }
  }
  cs_00.f_.m = (char)uVar4;
  cs_00.f_.d = (char)((ulong)uVar4 >> 8);
  cs_00.f_.hh = (char)((ulong)uVar4 >> 0x10);
  cs_00.f_.mm = (char)((ulong)uVar4 >> 0x18);
  cs_00.f_.ss = (char)((ulong)uVar4 >> 0x20);
  cs_00.f_._13_3_ = (int3)((ulong)uVar4 >> 0x28);
  cs_00.f_.y = ci.cs.f_.y;
  WVar2 = GetWeekday((lts_20240722 *)auStack_60,cs_00);
  switch(WVar2) {
  case monday:
    __return_storage_ptr__->tm_wday = 1;
    break;
  case tuesday:
    __return_storage_ptr__->tm_wday = 2;
    break;
  case wednesday:
    __return_storage_ptr__->tm_wday = 3;
    break;
  case thursday:
    __return_storage_ptr__->tm_wday = 4;
    break;
  case friday:
    __return_storage_ptr__->tm_wday = 5;
    break;
  case saturday:
    __return_storage_ptr__->tm_wday = 6;
    break;
  case sunday:
    __return_storage_ptr__->tm_wday = 0;
  }
  cs_01.f_.m = (char)extraout_RDX_02;
  cs_01.f_.d = (char)((ulong)extraout_RDX_02 >> 8);
  cs_01.f_.hh = (char)((ulong)extraout_RDX_02 >> 0x10);
  cs_01.f_.mm = (char)((ulong)extraout_RDX_02 >> 0x18);
  cs_01.f_.ss = (char)((ulong)extraout_RDX_02 >> 0x20);
  cs_01.f_._13_3_ = (int3)((ulong)extraout_RDX_02 >> 0x28);
  cs_01.f_.y = ci.cs.f_.y;
  iVar1 = GetYearDay((lts_20240722 *)auStack_60,cs_01);
  __return_storage_ptr__->tm_yday = iVar1 + -1;
  __return_storage_ptr__->tm_isdst = (uint)(((byte)ci.subsecond.rep_lo_ & 1) != 0);
  return __return_storage_ptr__;
}

Assistant:

struct tm ToTM(absl::Time t, absl::TimeZone tz) {
  struct tm tm = {};

  const auto ci = tz.At(t);
  const auto& cs = ci.cs;
  tm.tm_sec = cs.second();
  tm.tm_min = cs.minute();
  tm.tm_hour = cs.hour();
  tm.tm_mday = cs.day();
  tm.tm_mon = cs.month() - 1;

  // Saturates tm.tm_year in cases of over/underflow, accounting for the fact
  // that tm.tm_year is years since 1900.
  if (cs.year() < std::numeric_limits<int>::min() + 1900) {
    tm.tm_year = std::numeric_limits<int>::min();
  } else if (cs.year() > std::numeric_limits<int>::max()) {
    tm.tm_year = std::numeric_limits<int>::max() - 1900;
  } else {
    tm.tm_year = static_cast<int>(cs.year() - 1900);
  }

  switch (GetWeekday(cs)) {
    case Weekday::sunday:
      tm.tm_wday = 0;
      break;
    case Weekday::monday:
      tm.tm_wday = 1;
      break;
    case Weekday::tuesday:
      tm.tm_wday = 2;
      break;
    case Weekday::wednesday:
      tm.tm_wday = 3;
      break;
    case Weekday::thursday:
      tm.tm_wday = 4;
      break;
    case Weekday::friday:
      tm.tm_wday = 5;
      break;
    case Weekday::saturday:
      tm.tm_wday = 6;
      break;
  }
  tm.tm_yday = GetYearDay(cs) - 1;
  tm.tm_isdst = ci.is_dst ? 1 : 0;

  return tm;
}